

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O3

void __thiscall Pl_Buffer::Pl_Buffer(Pl_Buffer *this,char *identifier,Pipeline *next)

{
  Members *pMVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Buffer_002eb478;
  pMVar1 = (Members *)operator_new(0x28);
  *(undefined8 *)pMVar1 = 0;
  (pMVar1->data)._M_dataplus._M_p = (pointer)0x0;
  (pMVar1->data)._M_string_length = 0;
  (pMVar1->data).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pMVar1->data).field_2 + 8) = 0;
  pMVar1->ready = true;
  (pMVar1->data)._M_dataplus._M_p = (pointer)&(pMVar1->data).field_2;
  (this->m)._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
  ._M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

Pl_Buffer::Pl_Buffer(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
}